

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O2

void __thiscall ami_nvar_t::nvar_entry_body_t::~nvar_entry_body_t(nvar_entry_body_t *this)

{
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__nvar_entry_body_t_002808a8;
  std::__cxx11::string::~string((string *)&this->m_data);
  std::__cxx11::string::~string((string *)&this->m_invoke_data_start);
  std::unique_ptr<ami_nvar_t::ucs2_string_t,_std::default_delete<ami_nvar_t::ucs2_string_t>_>::
  ~unique_ptr(&this->m_ucs2_name);
  std::__cxx11::string::~string((string *)&this->m_ascii_name);
  std::__cxx11::string::~string((string *)&this->m_guid);
  std::__cxx11::string::~string((string *)&this->m_extended_header_hash);
  std::
  unique_ptr<ami_nvar_t::nvar_extended_attributes_t,_std::default_delete<ami_nvar_t::nvar_extended_attributes_t>_>
  ::~unique_ptr(&this->m_extended_header_attributes);
  return;
}

Assistant:

ami_nvar_t::nvar_entry_body_t::~nvar_entry_body_t() {
    _clean_up();
}